

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_frameProgression * ZSTD_getFrameProgression(ZSTD_CCtx *cctx)

{
  long in_RSI;
  ZSTD_frameProgression *in_RDI;
  ZSTD_frameProgression *fp;
  size_t buffered;
  ulong local_28;
  
  if (*(int *)(in_RSI + 300) < 1) {
    if (*(long *)(in_RSI + 0xdb8) == 0) {
      local_28 = 0;
    }
    else {
      local_28 = *(long *)(in_RSI + 0xdd0) - *(long *)(in_RSI + 0xdc8);
    }
    if ((local_28 != 0) && (*(ulong *)(in_RSI + 0xdd0) < *(ulong *)(in_RSI + 0xdc8))) {
      __assert_fail("cctx->inBuffPos >= cctx->inToCompress",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x57d8,"ZSTD_frameProgression ZSTD_getFrameProgression(const ZSTD_CCtx *)");
    }
    if (0x20000 < local_28) {
      __assert_fail("buffered <= ZSTD_BLOCKSIZE_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x57d9,"ZSTD_frameProgression ZSTD_getFrameProgression(const ZSTD_CCtx *)");
    }
    in_RDI->ingested = *(long *)(in_RSI + 0x2e8) + local_28;
    in_RDI->consumed = *(unsigned_long_long *)(in_RSI + 0x2e8);
    in_RDI->produced = *(unsigned_long_long *)(in_RSI + 0x2f0);
    in_RDI->flushed = *(unsigned_long_long *)(in_RSI + 0x2f0);
    in_RDI->currentJobID = 0;
    in_RDI->nbActiveWorkers = 0;
  }
  else {
    ZSTDMT_getFrameProgression((ZSTDMT_CCtx *)cctx);
  }
  return in_RDI;
}

Assistant:

ZSTD_frameProgression ZSTD_getFrameProgression(const ZSTD_CCtx* cctx)
{
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        return ZSTDMT_getFrameProgression(cctx->mtctx);
    }
#endif
    {   ZSTD_frameProgression fp;
        size_t const buffered = (cctx->inBuff == NULL) ? 0 :
                                cctx->inBuffPos - cctx->inToCompress;
        if (buffered) assert(cctx->inBuffPos >= cctx->inToCompress);
        assert(buffered <= ZSTD_BLOCKSIZE_MAX);
        fp.ingested = cctx->consumedSrcSize + buffered;
        fp.consumed = cctx->consumedSrcSize;
        fp.produced = cctx->producedCSize;
        fp.flushed  = cctx->producedCSize;   /* simplified; some data might still be left within streaming output buffer */
        fp.currentJobID = 0;
        fp.nbActiveWorkers = 0;
        return fp;
}   }